

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newConcurrencyLimitingHttpClient
          (kj *this,HttpClient *inner,uint maxConcurrentRequests,
          Function<void_(unsigned_int,_unsigned_int)> *countChangedCallback)

{
  Iface *pIVar1;
  undefined8 *puVar2;
  void *pvVar3;
  HttpClient *extraout_RDX;
  undefined8 *puVar4;
  Own<kj::HttpClient,_std::nullptr_t> OVar5;
  Own<kj::Function<void_(unsigned_int,_unsigned_int)>::Iface,_std::nullptr_t> local_38;
  
  puVar2 = (undefined8 *)operator_new(0x78);
  local_38.disposer = (countChangedCallback->impl).disposer;
  pIVar1 = (countChangedCallback->impl).ptr;
  (countChangedCallback->impl).ptr = (Iface *)0x0;
  *puVar2 = &PTR_request_00593040;
  puVar2[1] = inner;
  *(uint *)(puVar2 + 2) = maxConcurrentRequests;
  *(undefined4 *)((long)puVar2 + 0x14) = 0;
  puVar2[3] = local_38.disposer;
  local_38.ptr = (Iface *)0x0;
  puVar2[4] = pIVar1;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[6] = 8;
  pvVar3 = operator_new(0x40);
  puVar2[5] = pvVar3;
  puVar4 = (undefined8 *)((long)pvVar3 + 0x18);
  pvVar3 = operator_new(0x200);
  *puVar4 = pvVar3;
  puVar2[10] = puVar4;
  puVar2[8] = pvVar3;
  puVar2[9] = (long)pvVar3 + 0x200;
  puVar2[0xe] = puVar4;
  puVar2[0xc] = pvVar3;
  puVar2[0xd] = (long)pvVar3 + 0x200;
  puVar2[7] = pvVar3;
  puVar2[0xb] = pvVar3;
  Own<kj::Function<void_(unsigned_int,_unsigned_int)>::Iface,_std::nullptr_t>::dispose(&local_38);
  *(undefined8 **)this =
       &_::HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient>::instance;
  *(undefined8 **)(this + 8) = puVar2;
  OVar5.ptr = extraout_RDX;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<HttpClient> newConcurrencyLimitingHttpClient(
    HttpClient& inner, uint maxConcurrentRequests,
    kj::Function<void(uint runningCount, uint pendingCount)> countChangedCallback) {
  return kj::heap<ConcurrencyLimitingHttpClient>(inner, maxConcurrentRequests,
      kj::mv(countChangedCallback));
}